

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forwardDilation
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,conv_func conv,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  _func_int *p_Var4;
  undefined1 *puVar5;
  undefined8 uVar6;
  undefined8 uVar13;
  undefined8 uVar20;
  Mat *pMVar27;
  size_t sVar28;
  void *pvVar29;
  size_t sVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  int iVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  int iVar38;
  int iVar39;
  ulong uVar40;
  ulong uVar41;
  int iVar42;
  void *pvVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  undefined4 *puVar48;
  int iVar49;
  long lVar50;
  int local_260;
  undefined4 *local_240;
  Mat local_238;
  long local_1f8;
  long local_1f0;
  size_t local_1e8;
  Convolution_x86 *local_1e0;
  long local_1d8;
  ulong local_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  Mat bottom_blob_bordered;
  long local_158;
  long local_138;
  Mat inner_bottom_blob;
  Mat inner_top_blob;
  Option opt_g;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined3 uVar9;
  undefined1 uVar10;
  undefined2 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined3 uVar16;
  undefined1 uVar17;
  undefined2 uVar18;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined3 uVar23;
  undefined1 uVar24;
  undefined2 uVar25;
  undefined1 uVar26;
  
  iVar31 = bottom_blob->w;
  iVar38 = bottom_blob->h;
  local_1e8 = bottom_blob->elemsize;
  p_Var4 = this->_vptr_Convolution_x86[-3];
  iVar1 = *(int *)(p_Var4 + 0x2c + (long)&(this->weight_sgemm_data).data);
  iVar2 = *(int *)(p_Var4 + 0x3c + (long)&(this->weight_sgemm_data).data);
  uVar3 = *(uint *)(p_Var4 + 0x34 + (long)&(this->weight_sgemm_data).data);
  iVar42 = (iVar1 + -1) * uVar3;
  Mat::Mat(&bottom_blob_bordered,bottom_blob);
  p_Var4 = this->_vptr_Convolution_x86[-3];
  iVar34 = *(int *)(p_Var4 + 4 +
                   (long)&(this->weight_3x3_winograd43_data).
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>);
  iVar49 = *(int *)(p_Var4 + 8 +
                   (long)&(this->weight_3x3_winograd43_data).
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>);
  local_260 = -100;
  if (((iVar49 < 1 && iVar34 < 1) &&
      (iVar39 = *(int *)(p_Var4 + 0xc +
                        (long)&(this->weight_3x3_winograd43_data).
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
      iVar39 < 1)) &&
     (iVar32 = *(int *)(p_Var4 + 0x10 +
                       (long)&(this->weight_3x3_winograd43_data).
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>), iVar32 < 1
     )) {
    if (((iVar34 == -0xe9) && (iVar49 == -0xe9)) && ((iVar39 == -0xe9 && (iVar32 == -0xe9)))) {
      iVar49 = iVar42 - (iVar31 + -1) % iVar2;
      iVar34 = iVar42 - (iVar38 + -1) % iVar2;
      if ((0 < iVar49) ||
         (iVar31 = bottom_blob_bordered.w, iVar38 = bottom_blob_bordered.h, 0 < iVar34)) {
        inner_bottom_blob.allocator = *(Allocator **)&opt->use_int8_arithmetic;
        inner_bottom_blob.data = *(void **)opt;
        uVar13._0_1_ = opt->use_winograd_convolution;
        uVar13._1_1_ = opt->use_sgemm_convolution;
        uVar13._2_1_ = opt->use_int8_inference;
        uVar13._3_1_ = opt->use_vulkan_compute;
        uVar14 = opt->use_fp16_packed;
        uVar15 = opt->use_fp16_storage;
        uVar17 = opt->use_fp16_arithmetic;
        uVar19 = opt->use_int8_storage;
        uVar18 = CONCAT11(uVar19,uVar17);
        uVar16 = CONCAT21(uVar18,uVar15);
        uVar13._4_4_ = CONCAT31(uVar16,uVar14);
        inner_bottom_blob.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
        inner_bottom_blob.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        inner_bottom_blob.elempack = (int)uVar13;
        inner_bottom_blob.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
        inner_bottom_blob.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        inner_bottom_blob._28_4_ = uVar13._4_4_;
        copy_make_border(bottom_blob,&bottom_blob_bordered,iVar34 / 2,iVar34 - iVar34 / 2,iVar49 / 2
                         ,iVar49 - iVar49 / 2,0,
                         *(float *)(p_Var4 + 0x14 +
                                   (long)&(this->weight_3x3_winograd43_data).
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                         ,(Option *)&inner_bottom_blob);
        goto LAB_0011af8c;
      }
    }
    else if ((((iVar34 == -0xea) && (iVar49 == -0xea)) && (iVar39 == -0xea)) && (iVar32 == -0xea)) {
      iVar49 = iVar42 - (iVar31 + -1) % iVar2;
      iVar34 = iVar42 - (iVar38 + -1) % iVar2;
      if ((0 < iVar49) ||
         (iVar31 = bottom_blob_bordered.w, iVar38 = bottom_blob_bordered.h, 0 < iVar34)) {
        inner_bottom_blob.allocator = *(Allocator **)&opt->use_int8_arithmetic;
        inner_bottom_blob.data = *(void **)opt;
        uVar20._0_1_ = opt->use_winograd_convolution;
        uVar20._1_1_ = opt->use_sgemm_convolution;
        uVar20._2_1_ = opt->use_int8_inference;
        uVar20._3_1_ = opt->use_vulkan_compute;
        uVar21 = opt->use_fp16_packed;
        uVar22 = opt->use_fp16_storage;
        uVar24 = opt->use_fp16_arithmetic;
        uVar26 = opt->use_int8_storage;
        uVar25 = CONCAT11(uVar26,uVar24);
        uVar23 = CONCAT21(uVar25,uVar22);
        uVar20._4_4_ = CONCAT31(uVar23,uVar21);
        inner_bottom_blob.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
        inner_bottom_blob.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        inner_bottom_blob.elempack = (int)uVar20;
        inner_bottom_blob.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
        inner_bottom_blob.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        inner_bottom_blob._28_4_ = uVar20._4_4_;
        copy_make_border(bottom_blob,&bottom_blob_bordered,iVar34 - iVar34 / 2,iVar34 / 2,
                         iVar49 - iVar49 / 2,iVar49 / 2,0,
                         *(float *)(p_Var4 + 0x14 +
                                   (long)&(this->weight_3x3_winograd43_data).
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                         ,(Option *)&inner_bottom_blob);
        goto LAB_0011af8c;
      }
    }
  }
  else {
    inner_bottom_blob.allocator = *(Allocator **)&opt->use_int8_arithmetic;
    inner_bottom_blob.data = *(void **)opt;
    uVar6._0_1_ = opt->use_winograd_convolution;
    uVar6._1_1_ = opt->use_sgemm_convolution;
    uVar6._2_1_ = opt->use_int8_inference;
    uVar6._3_1_ = opt->use_vulkan_compute;
    uVar7 = opt->use_fp16_packed;
    uVar8 = opt->use_fp16_storage;
    uVar10 = opt->use_fp16_arithmetic;
    uVar12 = opt->use_int8_storage;
    uVar11 = CONCAT11(uVar12,uVar10);
    uVar9 = CONCAT21(uVar11,uVar8);
    uVar6._4_4_ = CONCAT31(uVar9,uVar7);
    inner_bottom_blob.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    inner_bottom_blob.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    inner_bottom_blob.elempack = (int)uVar6;
    inner_bottom_blob.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    inner_bottom_blob.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    inner_bottom_blob._28_4_ = uVar6._4_4_;
    copy_make_border(bottom_blob,&bottom_blob_bordered,
                     *(int *)(p_Var4 + 0xc +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     *(int *)(p_Var4 + 0x10 +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     iVar34,iVar49,0,
                     *(float *)(p_Var4 + 0x14 +
                               (long)&(this->weight_3x3_winograd43_data).
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     (Option *)&inner_bottom_blob);
LAB_0011af8c:
    if ((bottom_blob_bordered.data == (void *)0x0) ||
       (iVar31 = bottom_blob_bordered.w, iVar38 = bottom_blob_bordered.h,
       (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) goto LAB_0011b727;
  }
  iVar34 = (iVar31 - (iVar42 + 1)) / iVar2;
  iVar49 = iVar34 + 1;
  Mat::create(top_blob,iVar49,(iVar38 - (iVar42 + 1)) / iVar2 + 1,
              *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                      (long)&(this->weight_sgemm_data).data),local_1e8,opt->blob_allocator);
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    inner_bottom_blob.elemsize._0_4_ = 0;
    inner_bottom_blob.elemsize._4_4_ = 0;
    inner_bottom_blob.elempack = 0;
    inner_bottom_blob.data = (void *)0x0;
    inner_bottom_blob.refcount._0_4_ = 0;
    inner_bottom_blob.refcount._4_4_ = 0;
    inner_bottom_blob.allocator = (Allocator *)0x0;
    inner_bottom_blob.dims = 0;
    inner_bottom_blob.w = 0;
    inner_bottom_blob.h = 0;
    inner_bottom_blob.c = 0;
    inner_bottom_blob.cstep = 0;
    inner_top_blob.elemsize._0_4_ = 0;
    inner_top_blob.elemsize._4_4_ = 0;
    inner_top_blob.elempack = 0;
    inner_top_blob.data = (void *)0x0;
    inner_top_blob.refcount._0_4_ = 0;
    inner_top_blob.refcount._4_4_ = 0;
    inner_top_blob.allocator = (Allocator *)0x0;
    inner_top_blob.dims = 0;
    inner_top_blob.w = 0;
    inner_top_blob.h = 0;
    inner_top_blob.c = 0;
    inner_top_blob.cstep = 0;
    local_1c4 = (uVar3 - 1) + iVar31;
    local_1c8 = (uVar3 - 1) + iVar38;
    uVar40 = 0;
    if (0 < (int)uVar3) {
      uVar40 = (ulong)uVar3;
    }
    local_1f0 = 0;
    local_1f8 = 0;
    local_1e0 = this;
    for (uVar37 = 0; local_260 = 0, uVar37 != uVar40; uVar37 = uVar37 + 1) {
      local_1c0 = local_1c8 - (int)uVar37;
      local_158 = local_1f0;
      local_138 = local_1f8;
      for (uVar45 = 0; uVar45 != uVar3; uVar45 = uVar45 + 1) {
        uVar41 = (long)(local_1c4 - (int)uVar45) / (long)(int)uVar3;
        uVar35 = (long)local_1c0 / (long)(int)uVar3 & 0xffffffff;
        iVar39 = (int)uVar41;
        iVar38 = (iVar39 - iVar1) / iVar2;
        iVar32 = (int)((long)local_1c0 / (long)(int)uVar3);
        iVar42 = (iVar32 - iVar1) / iVar2;
        Mat::create(&inner_bottom_blob,iVar39,iVar32,bottom_blob->c,local_1e8,
                    opt->workspace_allocator);
        if ((inner_bottom_blob.data == (void *)0x0) ||
           ((long)inner_bottom_blob.c * inner_bottom_blob.cstep == 0)) {
LAB_0011b705:
          local_260 = -100;
          goto LAB_0011b70d;
        }
        local_1bc = iVar38 + 1;
        Mat::create(&inner_top_blob,local_1bc,iVar42 + 1,
                    *(int *)(local_1e0->_vptr_Convolution_x86[-3] + 0x28 +
                            (long)&(local_1e0->weight_sgemm_data).data),local_1e8,
                    opt->workspace_allocator);
        if ((inner_top_blob.data == (void *)0x0) ||
           ((long)inner_top_blob.c * inner_top_blob.cstep == 0)) goto LAB_0011b705;
        uVar41 = uVar41 & 0xffffffff;
        if (iVar39 < 1) {
          uVar41 = 0;
        }
        if (iVar32 < 1) {
          uVar35 = 0;
        }
        lVar47 = 0;
        local_1d0 = uVar35;
        while (sVar30 = inner_bottom_blob.cstep, pvVar43 = inner_bottom_blob.data,
              lVar47 < bottom_blob->c) {
          sVar28 = CONCAT44(inner_bottom_blob.elemsize._4_4_,(undefined4)inner_bottom_blob.elemsize)
          ;
          local_238.data =
               (void *)(inner_bottom_blob.cstep * lVar47 * sVar28 + (long)inner_bottom_blob.data);
          local_238.refcount = (int *)0x0;
          local_238.elempack = inner_bottom_blob.elempack;
          local_238.allocator = inner_bottom_blob.allocator;
          local_238.dims = 2;
          local_238.w = inner_bottom_blob.w;
          local_238.h = inner_bottom_blob.h;
          local_238.c = 1;
          local_238.cstep = (size_t)(inner_bottom_blob.h * inner_bottom_blob.w);
          local_238.elemsize = sVar28;
          Mat::~Mat(&local_238);
          pvVar43 = (void *)(sVar30 * sVar28 * lVar47 + (long)pvVar43);
          iVar32 = 0;
          local_1d8 = lVar47;
          for (uVar35 = 0; pvVar29 = bottom_blob_bordered.data, uVar35 != local_1d0;
              uVar35 = uVar35 + 1) {
            lVar47 = bottom_blob_bordered.cstep * local_1d8 * bottom_blob_bordered.elemsize;
            local_238.data = (void *)((long)bottom_blob_bordered.data + lVar47);
            local_238.refcount = (int *)0x0;
            local_238.elemsize = bottom_blob_bordered.elemsize;
            local_238.elempack = bottom_blob_bordered.elempack;
            local_238.allocator = bottom_blob_bordered.allocator;
            local_238.dims = 2;
            local_238.w = bottom_blob_bordered.w;
            local_238.h = bottom_blob_bordered.h;
            local_238.c = 1;
            local_238.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
            Mat::~Mat(&local_238);
            puVar48 = (undefined4 *)((long)pvVar29 + lVar47 + (long)iVar32 * 4 + local_138);
            for (uVar33 = 0; uVar41 != uVar33; uVar33 = uVar33 + 1) {
              *(undefined4 *)((long)pvVar43 + uVar33 * 4) = *puVar48;
              puVar48 = puVar48 + (int)uVar3;
            }
            pvVar43 = (void *)((long)pvVar43 + (long)iVar39 * 4);
            iVar32 = iVar32 + iVar31 * uVar3;
          }
          lVar47 = local_1d8 + 1;
        }
        opt_g.lightmode = opt->lightmode;
        opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g.num_threads = opt->num_threads;
        opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
        opt_g.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
        opt_g.use_winograd_convolution = opt->use_winograd_convolution;
        opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_g.use_int8_inference = opt->use_int8_inference;
        opt_g.use_vulkan_compute = opt->use_vulkan_compute;
        opt_g.use_fp16_packed = opt->use_fp16_packed;
        opt_g.use_fp16_storage = opt->use_fp16_storage;
        opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_g.use_int8_storage = opt->use_int8_storage;
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
        opt_g.blob_allocator = inner_top_blob.allocator;
        puVar5 = &local_1e0->field_0x140;
        pMVar27 = (Mat *)(&local_1e0->field_0x100 + (long)local_1e0->_vptr_Convolution_x86[-3]);
        if (iVar1 == 7) {
          puVar5 = &this->field_0x140;
          pMVar27 = &this->weight_sgemm_data;
        }
        (*conv)(&inner_bottom_blob,&inner_top_blob,pMVar27,
                (Mat *)(puVar5 + (long)local_1e0->_vptr_Convolution_x86[-3]),&opt_g);
        local_1d0 = (ulong)iVar42;
        local_1d8 = (long)local_1bc << 2;
        for (lVar47 = 0;
            lVar47 < *(int *)(local_1e0->_vptr_Convolution_x86[-3] + 0x28 +
                             (long)&(local_1e0->weight_sgemm_data).data); lVar47 = lVar47 + 1) {
          Mat::channel(&local_238,top_blob,(int)lVar47);
          local_240 = (undefined4 *)((long)local_238.data + local_158);
          Mat::~Mat(&local_238);
          lVar50 = 0;
          for (lVar46 = 0; pvVar43 = inner_top_blob.data, lVar46 <= (long)local_1d0;
              lVar46 = lVar46 + 1) {
            local_238.elemsize =
                 CONCAT44(inner_top_blob.elemsize._4_4_,(undefined4)inner_top_blob.elemsize);
            lVar44 = inner_top_blob.cstep * lVar47 * local_238.elemsize;
            local_238.data = (void *)((long)inner_top_blob.data + lVar44);
            local_238.refcount = (int *)0x0;
            local_238.elempack = inner_top_blob.elempack;
            local_238.allocator = inner_top_blob.allocator;
            local_238.dims = 2;
            local_238.w = inner_top_blob.w;
            local_238.h = inner_top_blob.h;
            local_238.c = 1;
            local_238.cstep = (size_t)(inner_top_blob.h * inner_top_blob.w);
            Mat::~Mat(&local_238);
            puVar48 = local_240;
            for (lVar36 = 0; lVar36 <= iVar38; lVar36 = lVar36 + 1) {
              *puVar48 = *(undefined4 *)((long)pvVar43 + lVar36 * 4 + lVar44 + lVar50);
              puVar48 = puVar48 + (int)uVar3;
            }
            lVar50 = lVar50 + local_1d8;
            local_240 = local_240 + (int)(iVar49 * uVar3);
          }
        }
        local_138 = local_138 + 4;
        local_158 = local_158 + 4;
      }
      local_1f8 = local_1f8 + (long)iVar31 * 4;
      local_1f0 = local_1f0 + (long)iVar34 * 4 + 4;
    }
LAB_0011b70d:
    Mat::~Mat(&inner_top_blob);
    Mat::~Mat(&inner_bottom_blob);
  }
LAB_0011b727:
  Mat::~Mat(&bottom_blob_bordered);
  return local_260;
}

Assistant:

int Convolution_x86::forwardDilation(const Mat& bottom_blob, Mat& top_blob, conv_func conv, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob_bordered.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            if (kernel_size == 7)
            {
            // FIXME conv7x7s1_sse use sgemm
            conv(inner_bottom_blob, inner_top_blob, weight_sgemm_data, bias_data, opt_g);
            }
            else
            {
            conv(inner_bottom_blob, inner_top_blob, weight_data, bias_data, opt_g);
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    return 0;
}